

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int luv_fs_access(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  lua_Integer lVar5;
  size_t sVar6;
  uv_fs_t *req;
  luv_req_t *plVar7;
  uv_loop_t *loop;
  char *pcVar8;
  char *pcVar9;
  luv_req_t *data;
  size_t sVar10;
  code *cb;
  ulong uVar11;
  uint uVar12;
  uint flags;
  
  pcVar4 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = lua_isnumber(L,2);
  if (iVar1 == 0) {
    iVar1 = lua_isstring(L,2);
    if (iVar1 == 0) {
      pcVar8 = "Expected string or integer for file access mode check";
LAB_0014810b:
      flags = luaL_argerror(L,2,pcVar8);
    }
    else {
      pcVar8 = lua_tolstring(L,2,(size_t *)0x0);
      sVar6 = strlen(pcVar8);
      flags = 0;
      for (sVar10 = 0; sVar6 != sVar10; sVar10 = sVar10 + 1) {
        uVar11 = (ulong)((byte)pcVar8[sVar10] - 0x52);
        if (0x26 < (byte)pcVar8[sVar10] - 0x52) {
LAB_0014825a:
          pcVar8 = "Unknown character in access mode string";
          goto LAB_0014810b;
        }
        uVar12 = 4;
        if (((0x100000001U >> (uVar11 & 0x3f) & 1) == 0) &&
           (uVar12 = 2, (0x2000000020U >> (uVar11 & 0x3f) & 1) == 0)) {
          if ((0x4000000040U >> (uVar11 & 0x3f) & 1) == 0) goto LAB_0014825a;
          uVar12 = 1;
        }
        flags = flags | uVar12;
      }
    }
  }
  else {
    lVar5 = lua_tointegerx(L,2,(int *)0x0);
    flags = (uint)lVar5;
  }
  iVar3 = 3;
  iVar1 = luv_check_continuation(L,3);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar7 = luv_setup_req(L,iVar1);
  req->data = plVar7;
  iVar1 = plVar7->callback_ref;
  loop = luv_loop(L);
  cb = (uv_fs_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_fs_cb;
  }
  iVar2 = uv_fs_access(loop,req,pcVar4,flags,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 != -2) {
      lua_rawgeti(L,-0xf4628,(long)plVar7->req_ref);
      return 1;
    }
    iVar3 = push_fs_result(L,req);
    if (req->fs_type == UV_FS_SCANDIR) {
      return iVar3;
    }
  }
  else {
    lua_pushnil(L);
    pcVar4 = req->path;
    pcVar8 = uv_err_name((int)req->result);
    pcVar9 = uv_strerror((int)req->result);
    if (pcVar4 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar8,pcVar9);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar8,pcVar9,req->path);
    }
    pcVar4 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar4);
  }
  luv_cleanup_req(L,(luv_req_t *)req->data);
  req->data = (void *)0x0;
  uv_fs_req_cleanup(req);
  return iVar3;
}

Assistant:

static int luv_fs_access(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  const char* path = luaL_checkstring(L, 1);
  int amode = luv_check_amode(L, 2);
  int ref = luv_check_continuation(L, 3);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  FS_CALL(access, req, path, amode);
}